

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite20_Test::TestBody
          (LiteBasicTest_AllLite20_Test *this)

{
  bool bVar1;
  Map<int,_proto2_unittest::TestAllTypesLite> *pMVar2;
  TestAllTypesLite *pTVar3;
  char *pcVar4;
  AssertHelper local_f8;
  Message local_f0;
  key_arg<int> local_e4;
  int32_t local_e0;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  key_arg<int> local_b4;
  int local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  key_arg<int> local_90;
  undefined1 local_80 [8];
  TestMessageMapLite message2;
  TestMessageMapLite message1;
  LiteBasicTest_AllLite20_Test *this_local;
  
  proto2_unittest::TestMessageMapLite::TestMessageMapLite
            ((TestMessageMapLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestMessageMapLite::TestMessageMapLite((TestMessageMapLite *)local_80);
  pMVar2 = proto2_unittest::TestMessageMapLite::mutable_map_int32_message
                     ((TestMessageMapLite *)&message2.field_0._impl_._cached_size_);
  local_90 = 0;
  pTVar3 = Map<int,_proto2_unittest::TestAllTypesLite>::operator[]<int>
                     (pMVar2,&stack0xffffffffffffff70);
  proto2_unittest::TestAllTypesLite::add_repeated_int32(pTVar3,100);
  pMVar2 = proto2_unittest::TestMessageMapLite::mutable_map_int32_message
                     ((TestMessageMapLite *)local_80);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  pTVar3 = Map<int,_proto2_unittest::TestAllTypesLite>::operator[]<int>
                     (pMVar2,(key_arg<int> *)
                             ((long)&gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 4));
  proto2_unittest::TestAllTypesLite::add_repeated_int32(pTVar3,0x65);
  proto2_unittest::TestMessageMapLite::CopyFrom
            ((TestMessageMapLite *)&message2.field_0._impl_._cached_size_,
             (TestMessageMapLite *)local_80);
  local_b0[1] = 1;
  pMVar2 = proto2_unittest::TestMessageMapLite::map_int32_message
                     ((TestMessageMapLite *)&message2.field_0._impl_._cached_size_);
  local_b4 = 0;
  pTVar3 = Map<int,_proto2_unittest::TestAllTypesLite>::at<int>(pMVar2,&local_b4);
  local_b0[0] = proto2_unittest::TestAllTypesLite::repeated_int32_size(pTVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a8,"1","message1.map_int32_message().at(0).repeated_int32_size()",
             local_b0 + 1,local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x241,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_dc = 0x65;
  pMVar2 = proto2_unittest::TestMessageMapLite::map_int32_message
                     ((TestMessageMapLite *)&message2.field_0._impl_._cached_size_);
  local_e4 = 0;
  pTVar3 = Map<int,_proto2_unittest::TestAllTypesLite>::at<int>(pMVar2,&local_e4);
  local_e0 = proto2_unittest::TestAllTypesLite::repeated_int32(pTVar3,0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d8,"101","message1.map_int32_message().at(0).repeated_int32(0)",
             &local_dc,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x242,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  proto2_unittest::TestMessageMapLite::~TestMessageMapLite((TestMessageMapLite *)local_80);
  proto2_unittest::TestMessageMapLite::~TestMessageMapLite
            ((TestMessageMapLite *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite20) {
  {
    // CopyFromMessageMap
    proto2_unittest::TestMessageMapLite message1, message2;

    (*message1.mutable_map_int32_message())[0].add_repeated_int32(100);
    (*message2.mutable_map_int32_message())[0].add_repeated_int32(101);

    message1.CopyFrom(message2);  // NOLINT

    // Checks repeated field is overwritten.
    EXPECT_EQ(1, message1.map_int32_message().at(0).repeated_int32_size());
    EXPECT_EQ(101, message1.map_int32_message().at(0).repeated_int32(0));
  }
}